

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTime.h
# Opt level: O0

void uSleep(long Microseconds)

{
  undefined1 local_20 [8];
  timespec req;
  long Microseconds_local;
  
  local_20 = (undefined1  [8])(Microseconds / 1000000);
  req.tv_sec = (Microseconds % 1000000) * 1000;
  req.tv_nsec = Microseconds;
  nanosleep((timespec *)local_20,(timespec *)0x0);
  return;
}

Assistant:

inline void uSleep(long Microseconds)
{
#ifdef _WIN32
	// From https://stackoverflow.com/questions/5801813/c-usleep-is-obsolete-workarounds-for-windows-mingw.
	HANDLE timer;
	LARGE_INTEGER ft;

	ft.QuadPart = -(10*(LONGLONG)Microseconds); // Convert to 100 nanosecond interval, negative value indicates relative time.

	timer = CreateWaitableTimer(NULL, TRUE, NULL);
	SetWaitableTimer(timer, &ft, 0, NULL, NULL, FALSE);
	//WaitForSingleObject(timer, INFINITE);
	WaitForSingleObject(timer, (DWORD)(1+Microseconds/1000));
	CloseHandle(timer);
#else 
	// usleep() is considered as obsolete.
	//usleep(Microseconds);
	struct timespec req;

	req.tv_sec = Microseconds/1000000; // Seconds.
	req.tv_nsec = (Microseconds%1000000)*1000; // Additional nanoseconds.
	nanosleep(&req, NULL);
#endif // _WIN32
}